

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::PipelineLayoutCreateInfo::PipelineLayoutCreateInfo
          (PipelineLayoutCreateInfo *this,deUint32 _descriptorSetCount,
          VkDescriptorSetLayout *_pSetLayouts,deUint32 _pushConstantRangeCount,
          VkPushConstantRange *_pPushConstantRanges)

{
  VkPushConstantRange *__last;
  VkPushConstantRange *__first;
  size_type sVar1;
  reference pvVar2;
  reference local_80;
  uint local_48;
  uint i;
  allocator<vk::VkPushConstantRange> local_31;
  VkPushConstantRange *local_30;
  VkPushConstantRange *_pPushConstantRanges_local;
  VkDescriptorSetLayout *pVStack_20;
  deUint32 _pushConstantRangeCount_local;
  VkDescriptorSetLayout *_pSetLayouts_local;
  PipelineLayoutCreateInfo *pPStack_10;
  deUint32 _descriptorSetCount_local;
  PipelineLayoutCreateInfo *this_local;
  
  local_30 = _pPushConstantRanges;
  _pPushConstantRanges_local._4_4_ = _pushConstantRangeCount;
  pVStack_20 = _pSetLayouts;
  _pSetLayouts_local._4_4_ = _descriptorSetCount;
  pPStack_10 = this;
  std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  vector(&this->m_setLayouts);
  __first = local_30;
  __last = local_30 + _pPushConstantRanges_local._4_4_;
  std::allocator<vk::VkPushConstantRange>::allocator(&local_31);
  std::vector<vk::VkPushConstantRange,std::allocator<vk::VkPushConstantRange>>::
  vector<vk::VkPushConstantRange_const*,void>
            ((vector<vk::VkPushConstantRange,std::allocator<vk::VkPushConstantRange>> *)
             &this->m_pushConstantRanges,__first,__last,&local_31);
  std::allocator<vk::VkPushConstantRange>::~allocator(&local_31);
  for (local_48 = 0; local_48 < _pSetLayouts_local._4_4_; local_48 = local_48 + 1) {
    std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
    push_back(&this->m_setLayouts,pVStack_20 + local_48);
  }
  (this->super_VkPipelineLayoutCreateInfo).sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  (this->super_VkPipelineLayoutCreateInfo).pNext = (void *)0x0;
  (this->super_VkPipelineLayoutCreateInfo).flags = 0;
  sVar1 = std::
          vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
          size(&this->m_setLayouts);
  (this->super_VkPipelineLayoutCreateInfo).setLayoutCount = (deUint32)sVar1;
  if ((this->super_VkPipelineLayoutCreateInfo).setLayoutCount == 0) {
    local_80 = (reference)0x0;
  }
  else {
    local_80 = std::
               vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
               ::operator[](&this->m_setLayouts,0);
  }
  (this->super_VkPipelineLayoutCreateInfo).pSetLayouts = local_80;
  sVar1 = std::vector<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>::size
                    (&this->m_pushConstantRanges);
  (this->super_VkPipelineLayoutCreateInfo).pushConstantRangeCount = (deUint32)sVar1;
  sVar1 = std::vector<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>::size
                    (&this->m_pushConstantRanges);
  if (sVar1 == 0) {
    (this->super_VkPipelineLayoutCreateInfo).pPushConstantRanges = (VkPushConstantRange *)0x0;
  }
  else {
    pvVar2 = std::vector<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>::
             operator[](&this->m_pushConstantRanges,0);
    (this->super_VkPipelineLayoutCreateInfo).pPushConstantRanges = pvVar2;
  }
  return;
}

Assistant:

PipelineLayoutCreateInfo::PipelineLayoutCreateInfo (deUint32							_descriptorSetCount,
													const vk::VkDescriptorSetLayout*	_pSetLayouts,
													deUint32							_pushConstantRangeCount,
													const vk::VkPushConstantRange*		_pPushConstantRanges)
	: m_pushConstantRanges(_pPushConstantRanges, _pPushConstantRanges + _pushConstantRangeCount)
{
	for (unsigned int i = 0; i < _descriptorSetCount; i++)
	{
		m_setLayouts.push_back(_pSetLayouts[i]);
	}

	sType = vk::VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
	pNext = DE_NULL;
	flags					= 0;
	setLayoutCount			= static_cast<deUint32>(m_setLayouts.size());
	pSetLayouts				= setLayoutCount > 0 ? &m_setLayouts[0] : DE_NULL;
	pushConstantRangeCount	= static_cast<deUint32>(m_pushConstantRanges.size());

	if (m_pushConstantRanges.size()) {
		pPushConstantRanges = &m_pushConstantRanges[0];
	}
	else
	{
		pPushConstantRanges = DE_NULL;
	}
}